

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O0

void __thiscall
vkt::sparse::anon_unknown_0::UBOTestInstance::UBOTestInstance
          (UBOTestInstance *this,Context *context,TestFlags flags)

{
  TestFlags flags_local;
  Context *context_local;
  UBOTestInstance *this_local;
  
  SparseBufferTestInstance::SparseBufferTestInstance
            (&this->super_SparseBufferTestInstance,context,flags);
  (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)&PTR__UBOTestInstance_016b0060;
  (this->super_SparseBufferTestInstance).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR__UBOTestInstance_016b0090;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(&this->m_vertexBuffer);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_vertexBufferAlloc);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::Move(&this->m_descriptorSetLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::Move(&this->m_descriptorPool);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::Move(&this->m_descriptorSet);
  return;
}

Assistant:

UBOTestInstance (Context& context, const TestFlags flags)
		: SparseBufferTestInstance	(context, flags)
	{
	}